

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

_Bool testbinaryfuse8(size_t size,size_t repeated_size)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  _Bool _Var3;
  uint uVar4;
  uint32_t uVar5;
  uint64_t *puVar6;
  uint8_t *puVar7;
  uint64_t uVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 local_98 [20];
  undefined8 uStack_84;
  uint uStack_7c;
  uint8_t *local_78;
  size_t local_68;
  void *local_60;
  uint64_t local_58;
  uint64_t local_50;
  ulong local_48;
  undefined8 uStack_40;
  long lVar15;
  
  printf("testing binary fuse8 with size %zu and %zu duplicates\n",size,repeated_size);
  uVar9 = (uint)size;
  local_98._8_4_ = uVar9;
  uVar10 = size & 0xffffffff;
  if (uVar9 == 0) {
    uVar4 = 4;
  }
  else {
    dVar11 = log((double)uVar10);
    dVar11 = floor(dVar11 / 1.2029723039923526 + 2.25);
    uVar4 = 1 << ((byte)(long)dVar11 & 0x1f);
  }
  local_98._12_4_ = 0x40000;
  if (uVar4 < 0x40000) {
    local_98._12_4_ = uVar4;
  }
  local_98._16_4_ = local_98._12_4_ - 1;
  dVar11 = 0.0;
  if (1 < uVar9) {
    dVar11 = log((double)uVar10);
    dVar11 = 3.4538776394910684 / dVar11 + 0.875;
    if (dVar11 <= 1.125) {
      dVar11 = 1.125;
    }
  }
  iVar14 = 0;
  if (1 < uVar9) {
    dVar11 = round(dVar11 * (double)uVar10);
    iVar14 = (int)(long)dVar11;
  }
  uVar4 = (local_98._12_4_ + iVar14) - 1;
  uVar4 = ((local_98._12_4_ + (uVar4 - uVar4 % (uint)local_98._12_4_)) - 1) / (uint)local_98._12_4_;
  uVar5 = 1;
  if (2 < uVar4) {
    uVar5 = uVar4 - 2;
  }
  uStack_84._0_4_ = uVar5;
  uStack_7c = (uVar5 + 2) * local_98._12_4_;
  uStack_84._4_4_ = uVar5 * local_98._12_4_;
  local_78 = (uint8_t *)calloc((ulong)uStack_7c,1);
  puVar6 = (uint64_t *)malloc(size * 8);
  auVar1 = _DAT_00109070;
  if (size != 0) {
    lVar15 = size - 1;
    auVar12._8_4_ = (int)lVar15;
    auVar12._0_8_ = lVar15;
    auVar12._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_00109070;
    auVar13 = _DAT_00109060;
    do {
      auVar16 = auVar13 ^ auVar1;
      if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                  auVar12._4_4_ < auVar16._4_4_) & 1)) {
        puVar6[uVar8] = uVar8;
      }
      if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
          auVar16._12_4_ <= auVar12._12_4_) {
        puVar6[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar15 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar15 + 2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar8);
  }
  _Var3 = binary_fuse8_populate(puVar6,uVar9,(binary_fuse8_t *)local_98);
  if (_Var3) {
    local_68 = repeated_size;
    free(puVar6);
    uVar9 = uStack_7c;
    uVar10 = (ulong)uStack_7c;
    puVar6 = (uint64_t *)malloc(uVar10 + 0x1c);
    puVar7 = local_78;
    local_50 = local_98._0_8_;
    *puVar6 = local_98._0_8_;
    *(uint *)(puVar6 + 3) = uVar9;
    local_60 = (void *)((long)puVar6 + 0x1c);
    uVar2 = local_98._8_8_;
    local_58 = uStack_84;
    iVar14 = local_98._12_4_;
    local_48 = local_98._8_8_;
    uStack_40 = 0;
    puVar6[1] = local_98._8_8_;
    puVar6[2] = uStack_84;
    memcpy(local_60,local_78,uVar10);
    free(puVar7);
    local_78 = (uint8_t *)0x0;
    local_98._0_8_ = local_50;
    local_98._0_16_ = CONCAT88(uVar2,local_98._0_8_);
    uStack_84 = local_58;
    local_98._16_4_ = iVar14 + -1;
    stack0xffffffffffffff78 = CONCAT412(uVar9,stack0xffffffffffffff78);
    puVar7 = (uint8_t *)malloc(uVar10);
    local_78 = puVar7;
    if (puVar7 != (uint8_t *)0x0) {
      memcpy(puVar7,local_60,uVar10);
    }
    if ((local_48 & 0xffffffff) == size) {
      free(puVar6);
      free(puVar7);
      stack0xffffffffffffff78 = (undefined1  [16])0x0;
      local_98._0_16_ = (undefined1  [16])0x0;
      local_78 = (uint8_t *)0x0;
      _Var3 = test(size,local_68,local_98,binary_fuse8_allocate_gen,binary_fuse8_free_gen,
                   binary_fuse8_size_in_bytes_gen,binary_fuse8_serialization_bytes_gen,
                   binary_fuse8_serialize_gen,binary_fuse8_deserialize_gen,binary_fuse8_populate_gen
                   ,binary_fuse8_contain_gen);
    }
    else {
      _Var3 = false;
      printf("size not (de-)serialized correctly, found %d, expected %zu.",local_48 & 0xffffffff,
             size);
      free(puVar6);
      free(local_78);
    }
  }
  else {
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool testbinaryfuse8(size_t size, size_t repeated_size) {
  printf("testing binary fuse8 with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse8_t filter;

  // size serialization test
  binary_fuse8_allocate((uint32_t)size, &filter);
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i;
  }
  if (!binary_fuse8_populate(big_set, (uint32_t)size, &filter)) {
    return false;
  }
  free(big_set);

  size_t buffer_size = binary_fuse8_serialization_bytes(&filter);
  char *buffer = (char *)malloc(buffer_size);
  binary_fuse8_serialize(&filter, buffer);
  binary_fuse8_free(&filter);
  binary_fuse8_deserialize(&filter, buffer);

  if (filter.Size != size) {
    printf("size not (de-)serialized correctly, found %d, expected %zu.",
           filter.Size, size);
    free(buffer);
    binary_fuse8_free(&filter);
    return false;
  }
  free(buffer);
  binary_fuse8_free(&filter);
  // end of size serialization test

  return test(size, repeated_size, &filter,
              binary_fuse8_allocate_gen,
              binary_fuse8_free_gen,
              binary_fuse8_size_in_bytes_gen,
              binary_fuse8_serialization_bytes_gen,
              binary_fuse8_serialize_gen,
              binary_fuse8_deserialize_gen,
              binary_fuse8_populate_gen,
              binary_fuse8_contain_gen);
}